

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

String __thiscall xmrig::Process::location(Process *this,Location location,char *fileName)

{
  int iVar1;
  char **__s;
  char *pcVar2;
  size_t sVar3;
  char *in_RCX;
  size_t extraout_RDX;
  size_t sVar4;
  size_t extraout_RDX_00;
  int iVar5;
  long lVar6;
  String SVar7;
  size_t size;
  long local_30;
  
  __s = (char **)operator_new__(0x208);
  memset(__s,0,0x208);
  local_30 = 0x208;
  iVar5 = (int)fileName;
  if (iVar5 == 1) {
    iVar1 = uv_cwd(__s,&local_30);
LAB_00145a5c:
    if ((-1 < iVar1) && (local_30 != 0)) {
      if (in_RCX != (char *)0x0) {
        lVar6 = local_30;
        if (iVar5 == 0) {
          pcVar2 = strrchr((char *)__s,0x2f);
          if (pcVar2 == (char *)0x0) goto LAB_00145aa4;
          lVar6 = (long)pcVar2 - (long)__s;
        }
        sVar3 = strlen(in_RCX);
        if ((sVar3 + lVar6) - 0x206 < 0xfffffffffffffdf8) goto LAB_00145aa4;
        *(char *)((long)__s + lVar6) = '/';
        strcpy((char *)((long)__s + lVar6 + 1),in_RCX);
      }
      (this->m_arguments).m_argv = __s;
      sVar3 = strlen((char *)__s);
      *(size_t *)&(this->m_arguments).m_argc = sVar3;
      sVar4 = extraout_RDX_00;
      goto LAB_00145ab2;
    }
  }
  else if (iVar5 == 0) {
    iVar1 = uv_exepath(__s,&local_30);
    goto LAB_00145a5c;
  }
LAB_00145aa4:
  operator_delete__(__s);
  (this->m_arguments).m_argv = (char **)0x0;
  *(undefined8 *)&(this->m_arguments).m_argc = 0;
  sVar4 = extraout_RDX;
LAB_00145ab2:
  SVar7.m_size = sVar4;
  SVar7.m_data = (char *)this;
  return SVar7;
}

Assistant:

xmrig::String xmrig::Process::location(Location location, const char *fileName) const
{
    constexpr const size_t max = 520;

    char *buf   = new char[max]();
    size_t size = ::location(location, buf, max);

    if (size == 0) {
        delete [] buf;

        return String();
    }

    if (fileName == nullptr) {
        return buf;
    }

    if (location == ExeLocation) {
        char *p = strrchr(buf, kDirSeparator);

        if (p == nullptr) {
            delete [] buf;

            return String();
        }

        size = static_cast<size_t>(p - buf);
    }

    if ((size + strlen(fileName) + 2) >= max) {
        delete [] buf;

        return String();
    }

    buf[size] = kDirSeparator;
    strcpy(buf + size + 1, fileName);

    return buf;
}